

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_opt0
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 ZSTD_dictMode_e dictMode)

{
  ZSTD_optimal_t *pZVar1;
  rawSeqStore_t *prVar2;
  seqDef *psVar3;
  undefined8 uVar4;
  U32 (*paUVar5) [3];
  ZSTD_optimal_t *pZVar6;
  U32 UVar7;
  ZSTD_match_t *pZVar8;
  optState_t *optPtr;
  U32 UVar9;
  U32 UVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  U32 *pUVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ZSTD_optimal_t *pZVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  int *piVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  BYTE *pBVar30;
  U32 UVar31;
  uint uVar32;
  ulong uVar33;
  BYTE *pBVar34;
  bool bVar35;
  repcodes_t rVar36;
  U32 nbMatches;
  ZSTD_match_t *local_128;
  ZSTD_optimal_t *local_120;
  optState_t *local_118;
  ulong local_110;
  BYTE *local_108;
  BYTE *local_100;
  BYTE *local_f8;
  int local_ec;
  uint local_e8;
  U32 nextToUpdate3;
  U32 (*local_e0) [3];
  U32 *local_d8;
  ulong local_d0;
  ulong local_c8;
  BYTE *local_c0;
  ulong local_b8;
  void *local_b0;
  undefined8 local_a8;
  U32 local_a0;
  seqStore_t *local_98;
  code *local_90;
  BYTE *local_88;
  ulong local_80;
  ZSTD_optimal_t *local_78;
  BYTE *local_70;
  ZSTD_optLdm_t local_68;
  
  uVar14 = (ms->cParams).minMatch;
  uVar13 = 3;
  if (uVar14 < 6) {
    uVar13 = uVar14 - 3;
  }
  uVar33 = 0;
  if (2 < uVar14) {
    uVar33 = (ulong)uVar13;
  }
  uVar13 = (ms->window).dictLimit;
  pBVar30 = (ms->window).base;
  uVar11 = (ms->cParams).targetLength;
  local_e8 = 0xfff;
  if (uVar11 < 0xfff) {
    local_e8 = uVar11;
  }
  local_118 = &ms->opt;
  nextToUpdate3 = ms->nextToUpdate;
  local_128 = (ms->opt).matchTable;
  pZVar1 = (ms->opt).priceTable;
  local_a8 = 0;
  local_f8 = (BYTE *)((long)src + srcSize);
  local_a0 = 0;
  local_90 = (code *)(&PTR_ZSTD_btGetAllMatches_noDict_3_00282ad0)[(ulong)dictMode * 4 + uVar33];
  local_b8 = (ulong)((uVar14 - 3 != 0) + 3);
  prVar2 = ms->ldmSeqStore;
  if (prVar2 == (rawSeqStore_t *)0x0) {
    local_68.seqStore.posInSequence = 0;
    local_68.seqStore.size = 0;
    local_68.seqStore.seq = (rawSeq *)0x0;
    local_68.seqStore.pos = 0;
    local_68.seqStore.capacity = 0;
  }
  else {
    local_68.seqStore.capacity = prVar2->capacity;
    local_68.seqStore.seq = prVar2->seq;
    local_68.seqStore.pos = prVar2->pos;
    local_68.seqStore.posInSequence = prVar2->posInSequence;
    local_68.seqStore.size = prVar2->size;
  }
  local_68.offset = 0;
  local_88 = (BYTE *)((long)src + (srcSize - 8));
  local_68.startPosInBlock = 0;
  local_68.endPosInBlock = 0;
  local_e0 = (U32 (*) [3])rep;
  local_b0 = src;
  local_98 = seqStore;
  ZSTD_opt_getNextMatchAndUpdateSeqStore(&local_68,0,(U32)srcSize);
  ZSTD_rescaleFreqs(local_118,(BYTE *)src,srcSize,0);
  pBVar30 = (BYTE *)((ulong)(pBVar30 + uVar13 == (BYTE *)src) + (long)src);
  local_70 = local_f8 + -0x20;
  local_80 = local_b8 & 0xffffffff;
  local_78 = pZVar1 + 1;
  local_ec = 0;
  local_c0 = (BYTE *)src;
  paUVar5 = local_e0;
  do {
    while( true ) {
      pBVar21 = local_f8;
      if (local_88 <= pBVar30) {
        return (long)local_f8 - (long)local_c0;
      }
      iVar24 = (int)pBVar30;
      UVar31 = iVar24 - (int)local_c0;
      nbMatches = (*local_90)(local_128,ms,&nextToUpdate3,pBVar30,local_f8,paUVar5,UVar31 == 0,
                              local_b8);
      ZSTD_optLdm_processMatchCandidate
                (&local_68,local_128,&nbMatches,iVar24 - (int)local_b0,(int)pBVar21 - iVar24);
      UVar10 = nbMatches;
      uVar33 = (ulong)nbMatches;
      if (uVar33 != 0) break;
      pBVar30 = pBVar30 + 1;
    }
    for (lVar15 = 4; lVar15 != 7; lVar15 = lVar15 + 1) {
      pZVar1->rep[lVar15 + -4] = paUVar5[-2][lVar15 + 2];
    }
    pZVar1->mlen = 0;
    pZVar1->litlen = UVar31;
    local_100 = pBVar30;
    UVar9 = ZSTD_litLengthPrice(UVar31,local_118,0);
    pZVar1->price = UVar9;
    uVar14 = local_128[UVar10 - 1].len;
    if (local_e8 < uVar14) {
      UVar10 = local_128[UVar10 - 1].off;
LAB_00167dab:
      uVar18 = 0;
    }
    else {
      if ((int)UVar9 < 0) {
        __assert_fail("opt[0].price >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x839b,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
      UVar10 = ZSTD_litLengthPrice(0,local_118,0);
      pZVar20 = local_78;
      for (uVar18 = 1; uVar18 < local_80; uVar18 = uVar18 + 1) {
        pZVar20->price = 0x40000000;
        pZVar20 = pZVar20 + 1;
      }
      for (uVar25 = 0; uVar25 != uVar33; uVar25 = uVar25 + 1) {
        uVar14 = local_128[uVar25].off;
        uVar13 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        iVar24 = uVar13 * 0x200 + -0x25cd;
        if (uVar13 < 0x14) {
          iVar24 = 0x33;
        }
        uVar11 = local_128[uVar25].len;
        while (uVar32 = (uint)uVar18, uVar32 <= uVar11) {
          if (uVar32 < 3) {
LAB_001680e1:
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x806c,
                          "U32 ZSTD_getMatchPrice(const U32, const U32, const optState_t *const, const int)"
                         );
          }
          if ((ms->opt).priceType == zop_predef) {
            iVar26 = 0x1f;
            if (uVar32 - 2 != 0) {
              for (; uVar32 - 2 >> iVar26 == 0; iVar26 = iVar26 + -1) {
              }
            }
            iVar26 = iVar26 * 0x100 + uVar13 * 0x100 + 0x1000;
          }
          else {
            uVar27 = uVar32 - 3;
            if (uVar27 < 0x80) {
              uVar27 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar27];
            }
            else {
              uVar12 = 0x1f;
              if (uVar27 != 0) {
                for (; uVar27 >> uVar12 == 0; uVar12 = uVar12 - 1) {
                }
              }
              uVar27 = (uVar12 ^ 0xffffffe0) + 0x44;
            }
            uVar28 = (ms->opt).offCodeFreq[uVar13] + 1;
            uVar12 = 0x1f;
            if (uVar28 != 0) {
              for (; uVar28 >> uVar12 == 0; uVar12 = uVar12 - 1) {
              }
            }
            uVar19 = (ms->opt).matchLengthFreq[uVar27] + 1;
            uVar28 = 0x1f;
            if (uVar19 != 0) {
              for (; uVar19 >> uVar28 == 0; uVar28 = uVar28 - 1) {
              }
            }
            iVar26 = (ms->opt).offCodeSumBasePrice + iVar24 + (uVar12 ^ 0x1f) * 0x100 +
                     (ms->opt).matchLengthSumBasePrice + (""[uVar27] + uVar13) * 0x100 +
                     (uVar28 ^ 0x1f) * 0x100 + -0x3e00;
          }
          uVar18 = uVar18 & 0xffffffff;
          pZVar1[uVar18].mlen = uVar32;
          pZVar1[uVar18].off = uVar14;
          pZVar1[uVar18].litlen = UVar31;
          pZVar1[uVar18].price = iVar26 + UVar10 + UVar9;
          uVar18 = (ulong)(uVar32 + 1);
        }
      }
      uVar33 = (ulong)((int)uVar18 - 1);
      piVar23 = (int *)0x1;
      pBVar30 = local_100;
      while( true ) {
        optPtr = local_118;
        pUVar16 = (U32 *)(uVar33 & 0xffffffff);
        if (pUVar16 < piVar23) break;
        local_d8 = pUVar16;
        if (piVar23 == (int *)0x1000) {
          __assert_fail("cur < ZSTD_OPT_NUM",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x83b6,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        local_d0 = (long)piVar23 * 0x1c;
        local_120 = pZVar1 + (long)piVar23;
        UVar31 = 1;
        if (pZVar1[(long)piVar23 + -1].mlen == 0) {
          UVar31 = local_120[-1].litlen + 1;
        }
        local_108 = pBVar30 + (long)piVar23;
        local_110 = CONCAT44(local_110._4_4_,local_120[-1].price);
        UVar10 = ZSTD_rawLiteralsCost
                           (local_108 + -1,(U32)local_118,(optState_t *)0x0,local_120[-1].price);
        local_c8 = CONCAT44(local_c8._4_4_,UVar10);
        UVar10 = ZSTD_litLengthPrice(UVar31,optPtr,0);
        iVar24 = UVar10 + (int)local_c8 + (U32)local_110;
        UVar10 = ZSTD_litLengthPrice(UVar31 - 1,optPtr,0);
        pBVar30 = local_100;
        pZVar20 = local_120;
        iVar24 = iVar24 - UVar10;
        if (999999999 < iVar24) {
          __assert_fail("price < 1000000000",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x83bf,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        iVar26 = (int)piVar23;
        if (*(int *)((long)pZVar1->rep + (local_d0 - 0x10)) < iVar24) {
          uVar14 = local_120->mlen;
          if (piVar23 < (int *)(ulong)uVar14) {
            __assert_fail("cur >= opt[cur].mlen",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x83d5,
                          "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                         );
          }
          if (uVar14 == 0) goto LAB_00167a93;
          rVar36 = ZSTD_newRep(pZVar1[iVar26 - uVar14].rep,local_120->off,
                               (uint)(local_120->litlen == 0));
          *&local_120->rep = rVar36.rep;
        }
        else {
          local_120->off = 0;
          local_120->mlen = 0;
          local_120->litlen = UVar31;
          local_120->price = iVar24;
LAB_00167a93:
          local_120->rep[2] = local_120[-1].rep[2];
          *(undefined8 *)local_120->rep = *(undefined8 *)local_120[-1].rep;
        }
        pZVar6 = local_120;
        if (local_108 <= local_88) {
          pUVar16 = local_d8;
          if ((U32 *)piVar23 == local_d8) break;
          uVar14 = local_120->price;
          if ((int)(uVar14 + 0x80) < local_120[1].price) {
            if ((int)uVar14 < 0) {
              __assert_fail("opt[cur].price >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x83e9,
                            "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                           );
            }
            local_110 = 0;
            bVar35 = pZVar20->mlen != 0;
            if (!bVar35) {
              local_110 = (ulong)local_120->litlen;
            }
            local_c8 = (ulong)bVar35;
            local_d8 = &pZVar20->mlen;
            local_d0 = (ulong)uVar14;
            UVar10 = ZSTD_litLengthPrice(0,local_118,0);
            pBVar21 = local_f8;
            pBVar30 = local_108;
            nbMatches = (*local_90)(local_128,ms,&nextToUpdate3,local_108,local_f8,pZVar6->rep,
                                    local_c8,local_b8);
            pZVar8 = local_128;
            ZSTD_optLdm_processMatchCandidate
                      (&local_68,local_128,&nbMatches,(int)pBVar30 - (int)local_b0,
                       (int)pBVar21 - (int)pBVar30);
            pBVar21 = (BYTE *)(ulong)nbMatches;
            pBVar30 = local_100;
            if (pBVar21 != (BYTE *)0x0) {
              uVar14 = pZVar8[nbMatches - 1].len;
              UVar31 = (U32)local_110;
              if ((local_e8 < uVar14) || (0xfff < iVar26 + uVar14)) {
                UVar9 = 0;
                if (*local_d8 == 0) {
                  UVar9 = local_120->litlen;
                }
                UVar10 = local_128[nbMatches - 1].off;
                uVar13 = iVar26 - UVar9;
                if (0x1000 < iVar26 - UVar9) {
                  uVar13 = 0;
                }
                uVar18 = (ulong)uVar13;
                goto LAB_00167dae;
              }
              for (pBVar22 = (BYTE *)0x0; local_108 = pBVar21, pBVar22 != pBVar21;
                  pBVar22 = pBVar22 + 1) {
                uVar18 = local_80;
                if (pBVar22 != (BYTE *)0x0) {
                  uVar18 = (ulong)(local_128[(long)(pBVar22 + -1)].len + 1);
                }
                uVar14 = local_128[(long)pBVar22].off;
                uVar13 = 0x1f;
                if (uVar14 != 0) {
                  for (; uVar14 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                  }
                }
                iVar24 = uVar13 * 0x200 + -0x25cd;
                if (uVar13 < 0x14) {
                  iVar24 = 0x33;
                }
                for (uVar25 = (ulong)local_128[(long)pBVar22].len; uVar18 <= uVar25;
                    uVar25 = uVar25 - 1) {
                  if (uVar25 < 3) goto LAB_001680e1;
                  UVar9 = (U32)uVar25;
                  if ((ms->opt).priceType == zop_predef) {
                    iVar29 = 0x1f;
                    if (UVar9 - 2 != 0) {
                      for (; UVar9 - 2 >> iVar29 == 0; iVar29 = iVar29 + -1) {
                      }
                    }
                    iVar29 = iVar29 * 0x100 + uVar13 * 0x100 + 0x1000;
                  }
                  else {
                    uVar11 = UVar9 - 3;
                    if (uVar11 < 0x80) {
                      uVar11 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar11];
                    }
                    else {
                      uVar32 = 0x1f;
                      if (uVar11 != 0) {
                        for (; uVar11 >> uVar32 == 0; uVar32 = uVar32 - 1) {
                        }
                      }
                      uVar11 = (uVar32 ^ 0xffffffe0) + 0x44;
                    }
                    uVar27 = (ms->opt).offCodeFreq[uVar13] + 1;
                    uVar32 = 0x1f;
                    if (uVar27 != 0) {
                      for (; uVar27 >> uVar32 == 0; uVar32 = uVar32 - 1) {
                      }
                    }
                    uVar12 = (ms->opt).matchLengthFreq[uVar11] + 1;
                    uVar27 = 0x1f;
                    if (uVar12 != 0) {
                      for (; uVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                      }
                    }
                    iVar29 = (uVar27 ^ 0x1f) * 0x100 +
                             (ms->opt).offCodeSumBasePrice + iVar24 + (uVar32 ^ 0x1f) * 0x100 +
                             (ms->opt).matchLengthSumBasePrice + (""[uVar11] + uVar13) * 0x100 +
                             -0x3e00;
                  }
                  iVar29 = iVar29 + UVar10 + (int)local_d0;
                  uVar17 = (ulong)(UVar9 + iVar26);
                  if ((UVar9 + iVar26 <= (uint)uVar33) && (pZVar1[uVar17].price <= iVar29)) break;
                  uVar33 = uVar33 & 0xffffffff;
                  pZVar20 = local_78 + uVar33;
                  for (; uVar33 < uVar17; uVar33 = uVar33 + 1) {
                    pZVar20->price = 0x40000000;
                    pZVar20 = pZVar20 + 1;
                  }
                  pZVar1[uVar17].mlen = UVar9;
                  pZVar1[uVar17].off = uVar14;
                  pZVar1[uVar17].litlen = UVar31;
                  pZVar1[uVar17].price = iVar29;
                }
              }
            }
          }
        }
        piVar23 = (int *)((long)piVar23 + 1);
      }
      local_ec = pZVar1[(long)pUVar16].price;
      UVar10 = pZVar1[(long)pUVar16].off;
      uVar14 = pZVar1[(long)pUVar16].mlen;
      UVar31 = pZVar1[(long)pUVar16].litlen;
      local_a0 = pZVar1[(long)pUVar16].rep[2];
      local_a8 = *(undefined8 *)pZVar1[(long)pUVar16].rep;
      uVar13 = (uint)uVar33 - (UVar31 + uVar14);
      uVar18 = (ulong)uVar13;
      if ((uint)uVar33 < UVar31 + uVar14 || uVar13 == 0) goto LAB_00167dab;
      if (0xfff < uVar13) {
        __assert_fail("cur < ZSTD_OPT_NUM",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8428,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
    }
LAB_00167dae:
    if (pZVar1->mlen != 0) {
      __assert_fail("opt[0].mlen == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x842b,
                    "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                   );
    }
    if (uVar14 == 0) {
      (*local_e0)[2] = pZVar1[uVar18].rep[2];
      *(undefined8 *)*local_e0 = *(undefined8 *)pZVar1[uVar18].rep;
    }
    else {
      rVar36 = ZSTD_newRep(pZVar1[uVar18].rep,UVar10,(uint)(UVar31 == 0));
      *local_e0 = rVar36.rep;
    }
    uVar13 = (int)uVar18 + 1;
    if (0xfff < uVar13) {
      __assert_fail("storeEnd < ZSTD_OPT_NUM",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x843e,
                    "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                   );
    }
    pBVar21 = (BYTE *)(ulong)uVar13;
    pZVar1[(long)pBVar21].price = local_ec;
    pZVar1[(long)pBVar21].off = UVar10;
    pZVar1[(long)pBVar21].mlen = uVar14;
    pZVar1[(long)pBVar21].litlen = UVar31;
    *(undefined8 *)pZVar1[(long)pBVar21].rep = local_a8;
    pZVar1[(long)pBVar21].rep[2] = local_a0;
    uVar33 = uVar18;
    while( true ) {
      uVar14 = (uint)uVar18;
      if (uVar14 == 0) break;
      uVar13 = pZVar1[uVar18].litlen + pZVar1[uVar18].mlen;
      pZVar20 = pZVar1 + uVar18;
      iVar24 = pZVar20->price;
      UVar10 = pZVar20->off;
      UVar9 = pZVar20->mlen;
      UVar7 = pZVar20->litlen;
      pZVar20 = pZVar1 + uVar18;
      UVar31 = pZVar20->rep[0];
      uVar4 = *(undefined8 *)(&pZVar20->litlen + 2);
      pZVar6 = pZVar1 + uVar33;
      pZVar6->litlen = pZVar20->litlen;
      pZVar6->rep[0] = UVar31;
      *(undefined8 *)(&pZVar6->litlen + 2) = uVar4;
      pZVar20 = pZVar1 + uVar33;
      pZVar20->price = iVar24;
      pZVar20->off = UVar10;
      pZVar20->mlen = UVar9;
      pZVar20->litlen = UVar7;
      uVar18 = (ulong)(uVar14 - uVar13);
      if (uVar14 < uVar13) {
        uVar18 = 0;
      }
      uVar33 = (ulong)((int)uVar33 - 1);
    }
    pBVar22 = local_c0;
    pBVar30 = local_100;
    local_108 = pBVar21;
    for (pBVar34 = (BYTE *)(ulong)((int)uVar33 + 1); pBVar34 <= pBVar21; pBVar34 = pBVar34 + 1) {
      uVar14 = pZVar1[(long)pBVar34].litlen;
      uVar33 = (ulong)uVar14;
      uVar13 = pZVar1[(long)pBVar34].mlen;
      if ((ulong)uVar13 == 0) {
        if (pBVar34 != pBVar21) {
          __assert_fail("storePos == storeEnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8457,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        pBVar30 = pBVar22 + uVar33;
      }
      else {
        pBVar30 = pBVar22 + uVar33;
        if (local_f8 < pBVar30) {
          __assert_fail("anchor + llen <= iend",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x845c,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        local_110 = CONCAT44(local_110._4_4_,pZVar1[(long)pBVar34].off);
        ZSTD_updateStats(local_118,uVar14,pBVar22,pZVar1[(long)pBVar34].off,uVar13);
        if (local_98->maxNbSeq <=
            (ulong)((long)local_98->sequences - (long)local_98->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_98->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        pBVar21 = local_98->lit;
        if (local_98->litStart + local_98->maxNbLit < pBVar21 + uVar33) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_70 < pBVar30) {
          ZSTD_safecopyLiterals(pBVar21,pBVar22,pBVar30,local_70);
LAB_00167f4a:
          local_98->lit = local_98->lit + uVar33;
          if (0xffff < uVar14) {
            if (local_98->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_98->longLengthType = ZSTD_llt_literalLength;
            local_98->longLengthPos =
                 (U32)((ulong)((long)local_98->sequences - (long)local_98->sequencesStart) >> 3);
          }
        }
        else {
          uVar4 = *(undefined8 *)(pBVar22 + 8);
          *(undefined8 *)pBVar21 = *(undefined8 *)pBVar22;
          *(undefined8 *)(pBVar21 + 8) = uVar4;
          if (0x10 < uVar14) {
            pBVar30 = local_98->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar30 + 0x10 + (-0x10 - (long)(pBVar22 + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar4 = *(undefined8 *)(pBVar22 + 0x18);
            *(undefined8 *)(pBVar30 + 0x10) = *(undefined8 *)(pBVar22 + 0x10);
            *(undefined8 *)(pBVar30 + 0x18) = uVar4;
            if (0x10 < uVar33 - 0x10) {
              lVar15 = 0;
              do {
                uVar4 = *(undefined8 *)(pBVar22 + lVar15 + 0x20 + 8);
                pBVar21 = pBVar30 + lVar15 + 0x20;
                *(undefined8 *)pBVar21 = *(undefined8 *)(pBVar22 + lVar15 + 0x20);
                *(undefined8 *)(pBVar21 + 8) = uVar4;
                uVar4 = *(undefined8 *)(pBVar22 + lVar15 + 0x30 + 8);
                *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)(pBVar22 + lVar15 + 0x30);
                *(undefined8 *)(pBVar21 + 0x18) = uVar4;
                lVar15 = lVar15 + 0x20;
              } while (pBVar21 + 0x20 < pBVar30 + uVar33);
              goto LAB_00167f4a;
            }
          }
          local_98->lit = local_98->lit + uVar33;
        }
        psVar3 = local_98->sequences;
        psVar3->litLength = (U16)uVar14;
        psVar3->offBase = (U32)local_110;
        if (uVar13 < 3) {
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar33 = (ulong)uVar13 - 3;
        if (0xffff < uVar33) {
          if (local_98->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_98->longLengthType = ZSTD_llt_matchLength;
          local_98->longLengthPos =
               (U32)((ulong)((long)psVar3 - (long)local_98->sequencesStart) >> 3);
        }
        psVar3->mlBase = (U16)uVar33;
        local_98->sequences = psVar3 + 1;
        pBVar22 = pBVar22 + (uVar13 + uVar14);
        pBVar21 = local_108;
        pBVar30 = pBVar22;
      }
    }
    ZSTD_setBasePrices(local_118,0);
    local_c0 = pBVar22;
    paUVar5 = local_e0;
  } while( true );
}

Assistant:

static size_t ZSTD_compressBlock_opt0(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize, const ZSTD_dictMode_e dictMode)
{
    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 0 /* optLevel */, dictMode);
}